

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgExpression.cpp
# Opt level: O2

void __thiscall
rsg::ConstructorOp::tokenize(ConstructorOp *this,GeneratorState *state,TokenStream *str)

{
  __normal_iterator<rsg::Expression_*const_*,_std::vector<rsg::Expression_*,_std::allocator<rsg::Expression_*>_>_>
  __tmp;
  pointer ppEVar1;
  Token local_38;
  
  VariableType::tokenizeShortType(&(this->m_valueRange).m_type,str);
  local_38.m_type = LEFT_PAREN;
  TokenStream::operator<<(str,&local_38);
  Token::~Token(&local_38);
  for (ppEVar1 = (this->m_inputExpressions).
                 super__Vector_base<rsg::Expression_*,_std::allocator<rsg::Expression_*>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      ppEVar1 !=
      (this->m_inputExpressions).
      super__Vector_base<rsg::Expression_*,_std::allocator<rsg::Expression_*>_>._M_impl.
      super__Vector_impl_data._M_start; ppEVar1 = ppEVar1 + -1) {
    if (ppEVar1 !=
        (this->m_inputExpressions).
        super__Vector_base<rsg::Expression_*,_std::allocator<rsg::Expression_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      local_38.m_type = COMMA;
      TokenStream::operator<<(str,&local_38);
      Token::~Token(&local_38);
    }
    (*ppEVar1[-1]->_vptr_Expression[3])(ppEVar1[-1],state,str);
  }
  local_38.m_type = RIGHT_PAREN;
  TokenStream::operator<<(str,&local_38);
  Token::~Token(&local_38);
  return;
}

Assistant:

void ConstructorOp::tokenize (GeneratorState& state, TokenStream& str) const
{
	const VariableType& type = m_valueRange.getType();
	DE_ASSERT(type.getPrecision() == VariableType::PRECISION_NONE);
	type.tokenizeShortType(str);

	str << Token::LEFT_PAREN;

	for (vector<Expression*>::const_reverse_iterator i = m_inputExpressions.rbegin(); i != m_inputExpressions.rend(); i++)
	{
		if (i != m_inputExpressions.rbegin())
			str << Token::COMMA;
		(*i)->tokenize(state, str);
	}

	str << Token::RIGHT_PAREN;
}